

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.cpp
# Opt level: O0

void __thiscall HighsTaskExecutor::ExecutorHandle::dispose(ExecutorHandle *this)

{
  long lVar1;
  __int_type _Var2;
  HighsTaskExecutor *in_RDI;
  bool in_stack_0000005f;
  HighsTaskExecutor *in_stack_00000060;
  Deleter<HighsTaskExecutor> *in_stack_fffffffffffffff0;
  
  lVar1._0_4_ = in_RDI->referenceCount;
  lVar1._4_1_ = in_RDI->hasStopped;
  lVar1._5_3_ = *(undefined3 *)&in_RDI->field_0x5;
  if (lVar1 != 0) {
    if (((ulong)(in_RDI->workerBunk).
                super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
        1) != 0) {
      stopWorkerThreads(in_stack_00000060,in_stack_0000005f);
    }
    _Var2 = std::__atomic_base<int>::operator--(*(__atomic_base<int> **)in_RDI);
    if (_Var2 == 0) {
      ::highs::cache_aligned::Deleter<HighsTaskExecutor>::operator()
                (in_stack_fffffffffffffff0,in_RDI);
    }
    in_RDI->referenceCount = (__atomic_base<int>)0x0;
    in_RDI->hasStopped = (__atomic_base<bool>)0x0;
    *(undefined3 *)&in_RDI->field_0x5 = 0;
  }
  return;
}

Assistant:

void HighsTaskExecutor::ExecutorHandle::dispose() {
  if (ptr == nullptr) return;
  if (isMain) {
    ptr->stopWorkerThreads(false);
  }

  // check to see if we are the last handle and if so, delete the executor
  if (--ptr->referenceCount == 0) {
    cache_aligned::Deleter<HighsTaskExecutor>()(ptr);
  }

  ptr = nullptr;
}